

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_api.cc
# Opt level: O1

string * __thiscall
re2c::InputAPI::stmt_peek_abi_cxx11_(string *__return_storage_ptr__,InputAPI *this,uint32_t ind)

{
  long lVar1;
  opt_t *poVar2;
  undefined8 *puVar3;
  long *plVar4;
  size_type *psVar5;
  int iVar6;
  ulong uVar7;
  undefined8 uVar8;
  string str;
  long *local_90;
  undefined8 local_88;
  long local_80;
  undefined8 uStack_78;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  string local_50;
  
  local_68 = 0;
  local_60 = 0;
  iVar6 = ind + 1;
  local_70 = &local_60;
  while( true ) {
    poVar2 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    if ((poVar2->target == DOT) || (iVar6 = iVar6 + -1, iVar6 == 0)) break;
    poVar2 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)(poVar2->indString)._M_dataplus._M_p);
  }
  expr_peek_save_abi_cxx11_(&local_50,this);
  uVar7 = 0xf;
  if (local_70 != &local_60) {
    uVar7 = CONCAT71(uStack_5f,local_60);
  }
  if (uVar7 < local_50._M_string_length + local_68) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      uVar8 = local_50.field_2._M_allocated_capacity;
    }
    if (local_50._M_string_length + local_68 <= (ulong)uVar8) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_70);
      goto LAB_001207d4;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50._M_dataplus._M_p);
LAB_001207d4:
  local_90 = &local_80;
  plVar4 = puVar3 + 2;
  if ((long *)*puVar3 == plVar4) {
    local_80 = *plVar4;
    uStack_78 = puVar3[3];
  }
  else {
    local_80 = *plVar4;
    local_90 = (long *)*puVar3;
  }
  local_88 = puVar3[1];
  *puVar3 = plVar4;
  puVar3[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar5) {
    lVar1 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InputAPI::stmt_peek (uint32_t ind) const
{
	return indent (ind) + expr_peek_save () + ";\n";
}